

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O3

void __thiscall QGraphicsItemPrivate::ensureSortedChildren(QGraphicsItemPrivate *this)

{
  qreal *pqVar1;
  long lVar2;
  double dVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  iterator __first;
  iterator __last;
  ulong uVar7;
  iterator iVar8;
  QGraphicsItem *pQVar9;
  uint uVar10;
  value_type __val_1;
  iterator iVar11;
  QGraphicsItem **ppQVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  QGraphicsItem **ppQVar16;
  size_t __n;
  iterator __i;
  QGraphicsItem **ppQVar17;
  value_type __val;
  bool bVar18;
  bool bVar19;
  
  if (((uint)*(ulong *)&this->field_0x160 >> 0x1d & 1) != 0) {
    *(ulong *)&this->field_0x160 = *(ulong *)&this->field_0x160 & 0xffffffffdfffffff;
    this->field_0x168 = this->field_0x168 | 0x20;
    if ((this->children).d.size != 0) {
      __first = QList<QGraphicsItem_*>::begin(&this->children);
      __last = QList<QGraphicsItem_*>::end(&this->children);
      if (__first.i != __last.i) {
        uVar7 = (long)__last.i - (long)__first.i >> 3;
        lVar14 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (__first,__last,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5ed4cc
                  );
        ppQVar17 = __first.i + 1;
        iVar8 = __first;
        if ((long)__last.i - (long)__first.i < 0x81) {
          for (; ppQVar17 != __last.i; ppQVar17 = ppQVar17 + 1) {
            pQVar4 = *ppQVar17;
            pQVar5 = ((*__first.i)->d_ptr).d;
            pQVar6 = (pQVar4->d_ptr).d;
            uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
            uVar10 = (uint)(uVar7 >> 0x28);
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar10) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar6->z;
              if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                if (pQVar6->siblingIndex < pQVar5->siblingIndex) goto LAB_005ec233;
                goto LAB_005ec1f9;
              }
              if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_005ec1f9;
LAB_005ec233:
              lVar14 = (long)ppQVar17 - (long)__first.i >> 3;
              iVar11 = __first;
              if (0 < lVar14) {
                lVar15 = 1;
                do {
                  iVar8.i[lVar15] = iVar8.i[lVar15 + -1];
                  lVar2 = lVar14 + lVar15;
                  lVar15 = lVar15 + -1;
                } while (1 < lVar2 - 1U);
              }
            }
            else {
              if (uVar7 != 0) goto LAB_005ec233;
LAB_005ec1f9:
              pQVar9 = *iVar8.i;
              pQVar5 = (pQVar9->d_ptr).d;
              ppQVar12 = iVar8.i;
              ppQVar16 = ppQVar17;
              if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) != uVar10)
              goto joined_r0x005ec275;
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar6->z;
              iVar11.i = ppQVar17;
              ppQVar16 = iVar8.i;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_005ec2a7;
              }
              else if (pQVar6->siblingIndex < pQVar5->siblingIndex) {
LAB_005ec2a7:
                do {
                  while( true ) {
                    ppQVar16[1] = pQVar9;
                    ppQVar12 = ppQVar16 + -1;
                    pQVar9 = ppQVar16[-1];
                    pQVar5 = (pQVar9->d_ptr).d;
                    pQVar6 = (pQVar4->d_ptr).d;
                    uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) !=
                        (uint)(uVar7 >> 0x28)) break;
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar6->z;
                    iVar11.i = ppQVar16;
                    ppQVar16 = ppQVar12;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_005ec30d;
                    }
                    else if (pQVar5->siblingIndex <= pQVar6->siblingIndex) goto LAB_005ec30d;
                  }
joined_r0x005ec275:
                  iVar11.i = ppQVar16;
                  ppQVar16 = ppQVar12;
                } while (uVar7 != 0);
              }
            }
LAB_005ec30d:
            *iVar11.i = pQVar4;
            iVar8.i = iVar8.i + 1;
          }
        }
        else {
          __n = 8;
          do {
            ppQVar12 = __first.i + __n;
            pQVar4 = *(QGraphicsItem **)((long)__first.i + __n);
            pQVar5 = ((*__first.i)->d_ptr).d;
            pQVar6 = (pQVar4->d_ptr).d;
            uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
            uVar10 = (uint)(uVar7 >> 0x28);
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar10) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar6->z;
              if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
                if (pQVar6->siblingIndex < pQVar5->siblingIndex) goto LAB_005ec136;
                goto LAB_005ec095;
              }
              if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_005ec095;
LAB_005ec136:
              memmove(ppQVar17,__first.i,__n);
              iVar11 = __first;
            }
            else {
              if (uVar7 != 0) goto LAB_005ec136;
LAB_005ec095:
              pQVar9 = *iVar8.i;
              pQVar5 = (pQVar9->d_ptr).d;
              iVar11.i = ppQVar12;
              if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) == uVar10) {
                dVar3 = pQVar5->z;
                pqVar1 = &pQVar6->z;
                bVar19 = dVar3 == *pqVar1;
                bVar18 = dVar3 < *pqVar1;
                if (!bVar19) goto LAB_005ec0ca;
                if (NAN(dVar3) || NAN(*pqVar1)) goto LAB_005ec0ca;
                if (pQVar6->siblingIndex < pQVar5->siblingIndex) {
LAB_005ec0cc:
                  do {
                    while( true ) {
                      while( true ) {
                        iVar11.i = iVar8.i;
                        iVar11.i[1] = pQVar9;
                        iVar8.i = iVar11.i + -1;
                        pQVar9 = iVar11.i[-1];
                        pQVar5 = (pQVar9->d_ptr).d;
                        pQVar6 = (pQVar4->d_ptr).d;
                        uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
                        if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                            (uint)(uVar7 >> 0x28)) break;
                        if (uVar7 == 0) goto LAB_005ec147;
                      }
                      dVar3 = pQVar5->z;
                      pqVar1 = &pQVar6->z;
                      bVar19 = dVar3 == *pqVar1;
                      bVar18 = dVar3 < *pqVar1;
                      if ((!bVar19) || (NAN(dVar3) || NAN(*pqVar1))) break;
                      if (pQVar5->siblingIndex <= pQVar6->siblingIndex) goto LAB_005ec147;
                    }
LAB_005ec0ca:
                  } while (!bVar18 && !bVar19);
                }
              }
              else if (uVar7 != 0) goto LAB_005ec0cc;
            }
LAB_005ec147:
            *iVar11.i = pQVar4;
            __n = __n + 8;
            iVar8.i = ppQVar12;
          } while (__n != 0x80);
          ppQVar17 = __first.i + 0x10;
          if (ppQVar17 != __last.i) {
LAB_005ec33f:
            pQVar9 = ppQVar17[-1];
            pQVar4 = *ppQVar17;
            pQVar5 = (pQVar9->d_ptr).d;
            pQVar6 = (pQVar4->d_ptr).d;
            uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
            ppQVar12 = ppQVar17;
            if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                (uint)(uVar7 >> 0x28)) {
              dVar3 = pQVar5->z;
              pqVar1 = &pQVar6->z;
              if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_005ec3a9;
              }
              else if (pQVar6->siblingIndex < pQVar5->siblingIndex) {
LAB_005ec3a9:
                do {
                  *ppQVar12 = pQVar9;
                  pQVar9 = ppQVar12[-2];
                  pQVar5 = (pQVar9->d_ptr).d;
                  pQVar6 = (pQVar4->d_ptr).d;
                  uVar7 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar5->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar7 >> 0x28)) {
                    dVar3 = pQVar5->z;
                    pqVar1 = &pQVar6->z;
                    if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                      if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_005ec40a;
                    }
                    else if (pQVar5->siblingIndex <= pQVar6->siblingIndex) goto LAB_005ec40a;
                  }
                  else if (uVar7 == 0) goto LAB_005ec40a;
                  ppQVar12 = ppQVar12 + -1;
                } while( true );
              }
            }
            else if (uVar7 != 0) goto LAB_005ec3a9;
            goto LAB_005ec40e;
          }
        }
      }
LAB_005ec41e:
      uVar7 = (this->children).d.size;
      if (uVar7 != 0) {
        uVar13 = 0;
        do {
          if (uVar13 != (uint)(((this->children).d.ptr[uVar13]->d_ptr).d)->siblingIndex) {
            this->field_0x168 = this->field_0x168 & 0xdf;
            return;
          }
          uVar13 = uVar13 + 1;
        } while (uVar7 != uVar13);
      }
    }
  }
  return;
LAB_005ec40a:
  ppQVar12 = ppQVar12 + -1;
LAB_005ec40e:
  *ppQVar12 = pQVar4;
  ppQVar17 = ppQVar17 + 1;
  if (ppQVar17 == __last.i) goto LAB_005ec41e;
  goto LAB_005ec33f;
}

Assistant:

inline void QGraphicsItemPrivate::ensureSortedChildren()
{
    if (needSortChildren) {
        needSortChildren = 0;
        sequentialOrdering = 1;
        if (children.isEmpty())
            return;
        std::sort(children.begin(), children.end(), qt_notclosestLeaf);
        for (int i = 0; i < children.size(); ++i) {
            if (children.at(i)->d_ptr->siblingIndex != i) {
                sequentialOrdering = 0;
                break;
            }
        }
    }
}